

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::PathArcToFast
          (ImDrawList *this,ImVec2 *centre,float radius,int a_min_of_12,int a_max_of_12)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int iVar5;
  ImVec2 *pIVar6;
  ImVec2 *pIVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int a;
  
  iVar10 = (this->_Path).Size;
  if (radius == 0.0 || a_max_of_12 < a_min_of_12) {
    iVar5 = (this->_Path).Capacity;
    if (iVar10 == iVar5) {
      if (iVar5 == 0) {
        iVar8 = 8;
      }
      else {
        iVar8 = iVar5 / 2 + iVar5;
      }
      iVar9 = iVar10 + 1;
      if (iVar10 + 1 < iVar8) {
        iVar9 = iVar8;
      }
      if (iVar5 < iVar9) {
        pIVar7 = (ImVec2 *)ImGui::MemAlloc((long)iVar9 << 3);
        pIVar6 = (this->_Path).Data;
        if (pIVar6 != (ImVec2 *)0x0) {
          memcpy(pIVar7,pIVar6,(long)(this->_Path).Size << 3);
          ImGui::MemFree((this->_Path).Data);
        }
        (this->_Path).Data = pIVar7;
        (this->_Path).Capacity = iVar9;
      }
    }
    (this->_Path).Data[(this->_Path).Size] = *centre;
    (this->_Path).Size = (this->_Path).Size + 1;
  }
  else {
    iVar10 = (a_max_of_12 - a_min_of_12) + iVar10 + 1;
    if ((this->_Path).Capacity < iVar10) {
      pIVar7 = (ImVec2 *)ImGui::MemAlloc((long)iVar10 << 3);
      pIVar6 = (this->_Path).Data;
      if (pIVar6 != (ImVec2 *)0x0) {
        memcpy(pIVar7,pIVar6,(long)(this->_Path).Size << 3);
        ImGui::MemFree((this->_Path).Data);
      }
      (this->_Path).Data = pIVar7;
      (this->_Path).Capacity = iVar10;
    }
    if (a_min_of_12 <= a_max_of_12) {
      do {
        iVar10 = a_min_of_12 +
                 (((uint)(a_min_of_12 / 6 + (a_min_of_12 >> 0x1f)) >> 1) - (a_min_of_12 >> 0x1f)) *
                 -0xc;
        fVar1 = this->_Data->CircleVtx12[iVar10].x;
        fVar2 = centre->x;
        fVar3 = this->_Data->CircleVtx12[iVar10].y;
        fVar4 = centre->y;
        iVar10 = (this->_Path).Size;
        iVar5 = (this->_Path).Capacity;
        if (iVar10 == iVar5) {
          if (iVar5 == 0) {
            iVar8 = 8;
          }
          else {
            iVar8 = iVar5 / 2 + iVar5;
          }
          iVar10 = iVar10 + 1;
          if (iVar10 < iVar8) {
            iVar10 = iVar8;
          }
          if (iVar5 < iVar10) {
            pIVar7 = (ImVec2 *)ImGui::MemAlloc((long)iVar10 << 3);
            pIVar6 = (this->_Path).Data;
            if (pIVar6 != (ImVec2 *)0x0) {
              memcpy(pIVar7,pIVar6,(long)(this->_Path).Size << 3);
              ImGui::MemFree((this->_Path).Data);
            }
            (this->_Path).Data = pIVar7;
            (this->_Path).Capacity = iVar10;
          }
        }
        pIVar6 = (this->_Path).Data;
        iVar10 = (this->_Path).Size;
        pIVar6[iVar10].x = fVar1 * radius + fVar2;
        pIVar6[iVar10].y = fVar3 * radius + fVar4;
        (this->_Path).Size = (this->_Path).Size + 1;
        a_min_of_12 = a_min_of_12 + 1;
      } while (a_max_of_12 + 1 != a_min_of_12);
    }
  }
  return;
}

Assistant:

void ImDrawList::PathArcToFast(const ImVec2& centre, float radius, int a_min_of_12, int a_max_of_12)
{
    if (radius == 0.0f || a_min_of_12 > a_max_of_12)
    {
        _Path.push_back(centre);
        return;
    }
    _Path.reserve(_Path.Size + (a_max_of_12 - a_min_of_12 + 1));
    for (int a = a_min_of_12; a <= a_max_of_12; a++)
    {
        const ImVec2& c = _Data->CircleVtx12[a % IM_ARRAYSIZE(_Data->CircleVtx12)];
        _Path.push_back(ImVec2(centre.x + c.x * radius, centre.y + c.y * radius));
    }
}